

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O1

uint32_t anon_unknown.dwarf_3099579::DecodeBits
                   (const_iterator *bitpos,const_iterator *endpos,uint8_t minval,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *bit_sizes)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  char cVar9;
  byte *pbVar10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar10 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pbVar7 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar7) {
    uVar6 = (uint)minval;
    do {
      pbVar1 = pbVar10 + 1;
      if (pbVar1 == pbVar7) {
LAB_0074111a:
        if (*pbVar10 == 0) goto LAB_00741104;
        uVar8 = 0;
        cVar9 = -1;
        goto LAB_00741128;
      }
      puVar4 = (bitpos->super__Bit_iterator_base)._M_p;
      uVar8 = (bitpos->super__Bit_iterator_base)._M_offset;
      if ((puVar4 == (endpos->super__Bit_iterator_base)._M_p) &&
         (uVar8 == (endpos->super__Bit_iterator_base)._M_offset)) break;
      uVar5 = *puVar4;
      (bitpos->super__Bit_iterator_base)._M_offset = uVar8 + 1;
      if (uVar8 == 0x3f) {
        (bitpos->super__Bit_iterator_base)._M_offset = 0;
        (bitpos->super__Bit_iterator_base)._M_p = puVar4 + 1;
      }
      if ((1L << ((byte)uVar8 & 0x3f) & uVar5) == 0) goto LAB_0074111a;
      uVar6 = uVar6 + (1 << (*pbVar10 & 0x1f));
      pbVar7 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pbVar10 = pbVar1;
    } while (pbVar1 != pbVar7);
  }
LAB_007410ff:
  uVar6 = 0xffffffff;
LAB_00741104:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return uVar6;
  while( true ) {
    uVar5 = *puVar4;
    (bitpos->super__Bit_iterator_base)._M_offset = uVar2 + 1;
    if (uVar2 == 0x3f) {
      (bitpos->super__Bit_iterator_base)._M_offset = 0;
      (bitpos->super__Bit_iterator_base)._M_p = puVar4 + 1;
    }
    uVar6 = uVar6 + ((uint)((1L << ((byte)uVar2 & 0x3f) & uVar5) != 0) << (cVar9 + *pbVar10 & 0x1f))
    ;
    uVar8 = uVar8 + 1;
    cVar9 = cVar9 + -1;
    if (*pbVar10 <= uVar8) break;
LAB_00741128:
    puVar4 = (bitpos->super__Bit_iterator_base)._M_p;
    uVar2 = (bitpos->super__Bit_iterator_base)._M_offset;
    if ((puVar4 == (endpos->super__Bit_iterator_base)._M_p) &&
       (uVar2 == (endpos->super__Bit_iterator_base)._M_offset)) goto LAB_007410ff;
  }
  goto LAB_00741104;
}

Assistant:

uint32_t DecodeBits(std::vector<bool>::const_iterator& bitpos, const std::vector<bool>::const_iterator& endpos, uint8_t minval, const std::vector<uint8_t> &bit_sizes)
{
    uint32_t val = minval;
    bool bit;
    for (std::vector<uint8_t>::const_iterator bit_sizes_it = bit_sizes.begin();
        bit_sizes_it != bit_sizes.end(); ++bit_sizes_it) {
        if (bit_sizes_it + 1 != bit_sizes.end()) {
            if (bitpos == endpos) break;
            bit = *bitpos;
            bitpos++;
        } else {
            bit = 0;
        }
        if (bit) {
            val += (1 << *bit_sizes_it);
        } else {
            for (int b = 0; b < *bit_sizes_it; b++) {
                if (bitpos == endpos) return INVALID; // Reached EOF in mantissa
                bit = *bitpos;
                bitpos++;
                val += bit << (*bit_sizes_it - 1 - b);
            }
            return val;
        }
    }
    return INVALID; // Reached EOF in exponent
}